

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfnt.cpp
# Opt level: O1

void __thiscall
dpfb::SfntOffsetTable::SfntOffsetTable(SfntOffsetTable *this,Stream *stream,uint32_t fontIdx)

{
  pointer *ppTVar1;
  iterator __position;
  TableRecord TVar2;
  long lVar3;
  ushort uVar4;
  runtime_error *prVar5;
  long lVar6;
  uint uVar7;
  ushort uVar8;
  uint32_t value;
  uint32_t value_6;
  string local_50;
  uint local_2c;
  
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tableRecords).
  super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*stream->_vptr_Stream[7])(stream,0,0);
  (*stream->_vptr_Stream[5])(stream,&local_50,4);
  uVar7 = CONCAT22(local_50._M_dataplus._M_p._2_2_,(ushort)local_50._M_dataplus._M_p);
  if (uVar7 == 0x66637474) {
    (*stream->_vptr_Stream[5])(stream,&local_50,2);
    uVar4 = (ushort)local_50._M_dataplus._M_p << 8 | (ushort)local_50._M_dataplus._M_p >> 8;
    if ((ushort)(uVar4 - 3) < 0xfffe) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_(&local_50,"Invalid TTC header major version %u",(ulong)uVar4);
      std::runtime_error::runtime_error(prVar5,(string *)&local_50);
      *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
      __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_Stream[5])(stream,&local_50,2);
    if ((ushort)local_50._M_dataplus._M_p != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_
                (&local_50,"Invalid TTC header minor version %u",
                 (ulong)(ushort)((ushort)local_50._M_dataplus._M_p << 8 |
                                (ushort)local_50._M_dataplus._M_p >> 8));
      std::runtime_error::runtime_error(prVar5,(string *)&local_50);
      *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
      __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_Stream[5])(stream,&local_50,4);
    if (CONCAT22(local_50._M_dataplus._M_p._2_2_,(ushort)local_50._M_dataplus._M_p) == 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Collection has no fonts");
      *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
      __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar7 = (uint)(local_50._M_dataplus._M_p._2_2_ >> 8) |
            ((local_50._M_dataplus._M_p._2_2_ & 0xff) << 0x10) >> 8 |
            ((ushort)local_50._M_dataplus._M_p & 0xff00) << 8 |
            CONCAT22(local_50._M_dataplus._M_p._2_2_,(ushort)local_50._M_dataplus._M_p) << 0x18;
    if (uVar7 <= fontIdx) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_(&local_50,"Collection contains only %u fonts",(ulong)uVar7);
      std::runtime_error::runtime_error(prVar5,(string *)&local_50);
      *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
      __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_Stream[7])(stream,(ulong)fontIdx << 2,1);
    (*stream->_vptr_Stream[5])(stream,&local_50,4);
    (*stream->_vptr_Stream[7])
              (stream,(ulong)((uint)(local_50._M_dataplus._M_p._2_2_ >> 8) |
                              ((local_50._M_dataplus._M_p._2_2_ & 0xff) << 0x10) >> 8 |
                              ((ushort)local_50._M_dataplus._M_p & 0xff00) << 8 |
                             CONCAT22(local_50._M_dataplus._M_p._2_2_,
                                      (ushort)local_50._M_dataplus._M_p) << 0x18),0);
    (*stream->_vptr_Stream[5])(stream,&local_50,4);
    uVar7 = CONCAT22(local_50._M_dataplus._M_p._2_2_,(ushort)local_50._M_dataplus._M_p);
  }
  else if (fontIdx != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    str::format_abi_cxx11_
              (&local_50,"Can\'t load font at index %u because font is not a collection",
               (ulong)fontIdx);
    std::runtime_error::runtime_error(prVar5,(string *)&local_50);
    *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
    __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  if (uVar7 != 0x10000) {
    lVar3 = 0;
    do {
      lVar6 = lVar3;
      if (lVar6 == 0x10) goto LAB_0011ca0f;
      lVar3 = lVar6 + 4;
    } while (*(uint *)(checkOffsetTableSignature(unsigned_int)::signatures + lVar6 + 4) != uVar7);
    if (lVar6 == 0x10) {
LAB_0011ca0f:
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_(&local_50,"Unsupported font format 0x%08x",(ulong)uVar7);
      std::runtime_error::runtime_error(prVar5,(string *)&local_50);
      *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
      __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  (*stream->_vptr_Stream[5])(stream,&local_50,2);
  uVar4 = (ushort)local_50._M_dataplus._M_p;
  if ((ushort)local_50._M_dataplus._M_p != 0) {
    (*stream->_vptr_Stream[7])(stream,6,1);
    uVar8 = uVar4 << 8 | uVar4 >> 8;
    std::
    vector<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
    ::reserve(&this->tableRecords,(ulong)uVar8);
    uVar4 = 1;
    if (1 < uVar8) {
      uVar4 = uVar8;
    }
    do {
      (*stream->_vptr_Stream[5])(stream,&local_2c,4);
      uVar8 = (ushort)(local_2c >> 8);
      local_50._M_dataplus._M_p._0_2_ = (ushort)(byte)(local_2c >> 0x18) | uVar8 & 0xff00;
      local_50._M_dataplus._M_p._2_2_ = uVar8 & 0xff | (ushort)((local_2c << 0x18) >> 0x10);
      (*stream->_vptr_Stream[7])(stream,4,1);
      (*stream->_vptr_Stream[5])(stream,&local_2c,4);
      local_50._M_dataplus._M_p._4_4_ =
           local_2c >> 0x18 | (local_2c & 0xff0000) >> 8 | (local_2c & 0xff00) << 8 |
           local_2c << 0x18;
      __position._M_current =
           (this->tableRecords).
           super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->tableRecords).
          super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<dpfb::SfntOffsetTable::TableRecord,std::allocator<dpfb::SfntOffsetTable::TableRecord>>
        ::_M_realloc_insert<dpfb::SfntOffsetTable::TableRecord_const&>
                  ((vector<dpfb::SfntOffsetTable::TableRecord,std::allocator<dpfb::SfntOffsetTable::TableRecord>>
                    *)this,__position,(TableRecord *)&local_50);
      }
      else {
        TVar2.tag._2_2_ = local_50._M_dataplus._M_p._2_2_;
        TVar2.tag._0_2_ = (ushort)local_50._M_dataplus._M_p;
        TVar2.offset = local_50._M_dataplus._M_p._4_4_;
        *__position._M_current = TVar2;
        ppTVar1 = &(this->tableRecords).
                   super__Vector_base<dpfb::SfntOffsetTable::TableRecord,_std::allocator<dpfb::SfntOffsetTable::TableRecord>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      (*stream->_vptr_Stream[7])(stream,4,1);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Font has no tables");
  *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
  __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SfntOffsetTable::SfntOffsetTable(
        Stream& stream, std::uint32_t fontIdx)
    : tableRecords {}
{
    stream.seek(0, SeekOrigin::set);

    auto version = stream.readU32Be();
    if (version == sfntTag('t', 't', 'c', 'f')) {
        const auto versionMajor = stream.readU16Be();
        if (versionMajor != 1 && versionMajor != 2)
            throw StreamError(str::format(
                "Invalid TTC header major version %" PRIu16,
                versionMajor));

        const auto versionMinor = stream.readU16Be();
        if (versionMinor != 0)
            throw StreamError(str::format(
                "Invalid TTC header minor version %" PRIu16,
                versionMinor));

        const auto numFonts = stream.readU32Be();
        if (numFonts == 0)
            throw StreamError("Collection has no fonts");

        if (fontIdx >= numFonts)
            throw StreamError(str::format(
                "Collection contains only %" PRIu32 " fonts",
                numFonts));

        stream.seek(fontIdx * sizeof(std::uint32_t), SeekOrigin::cur);
        const auto fontOffset = stream.readU32Be();
        stream.seek(fontOffset, SeekOrigin::set);

        version = stream.readU32Be();
    } else if (fontIdx > 0)
        throw StreamError(str::format(
            "Can't load font at index %" PRIu32 " because font is "
            "not a collection",
            fontIdx));

    if (!checkOffsetTableSignature(version))
        throw StreamError(str::format(
            "Unsupported font format 0x%08" PRIx32,
            version));

    const auto numTables = stream.readU16Be();
    if (numTables == 0)
        throw StreamError("Font has no tables");

    // Skip search range, entry selector, and range shift
    stream.seek(3 * sizeof(std::uint16_t), SeekOrigin::cur);

    tableRecords.reserve(numTables);
    for (std::uint16_t i = 0; i < numTables; ++i) {
        TableRecord tableRecord;
        tableRecord.tag = stream.readU32Be();

        // Skip checksum
        stream.seek(sizeof(std::uint32_t), SeekOrigin::cur);

        tableRecord.offset = stream.readU32Be();
        tableRecords.push_back(tableRecord);

        // Skip length
        stream.seek(sizeof(std::uint32_t), SeekOrigin::cur);
    }
}